

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

iterator * __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::operator--(iterator *this,int param_2)

{
  iterator *in_RDI;
  iterator *tmp;
  iterator *in_stack_ffffffffffffffb8;
  iterator *this_00;
  
  this_00 = in_RDI;
  iterator(in_RDI,in_stack_ffffffffffffffb8);
  operator--(this_00);
  return in_RDI;
}

Assistant:

iterator operator--(int) {
        iterator tmp(*this);
        --(*this);
        return tmp;
    }